

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  InternalMetadata *this_00;
  CppType CVar1;
  int iVar2;
  Arena *pAVar3;
  LogMessage *pLVar4;
  Extension *pEVar5;
  undefined4 extraout_var;
  Arena *pAVar7;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar8;
  LogFinisher local_69;
  LogMessage local_68;
  MessageLite *pMVar6;
  
  if (message == (MessageLite *)0x0) {
    ClearExtension(this,number);
    return;
  }
  this_00 = &message->_internal_metadata_;
  pAVar3 = InternalMetadata::owning_arena(this_00);
  if (pAVar3 != (Arena *)0x0) {
    pAVar3 = InternalMetadata::owning_arena(this_00);
    if (pAVar3 != this->arena_) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2a6);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: message->GetOwningArena() == nullptr || message->GetOwningArena() == arena_: "
                         );
      LogFinisher::operator=(&local_69,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
  }
  pAVar3 = InternalMetadata::owning_arena(this_00);
  pVar8 = Insert(this,number);
  pEVar5 = pVar8.first;
  pEVar5->descriptor = descriptor;
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar5->is_repeated != false) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2b8);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=(&local_69,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    CVar1 = anon_unknown_26::cpp_type(pEVar5->type);
    if (CVar1 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2b8);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_69,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    if ((pEVar5->field_0xa & 0x10) != 0) {
      (*((pEVar5->field_0).message_value)->_vptr_MessageLite[5])
                ((pEVar5->field_0).message_value,message,this->arena_);
      goto LAB_002d81ef;
    }
    pAVar7 = this->arena_;
    if (pAVar7 == (Arena *)0x0) {
      if ((pEVar5->field_0).message_value != (MessageLite *)0x0) {
        (*((pEVar5->field_0).message_value)->_vptr_MessageLite[1])();
        goto LAB_002d80d6;
      }
      pAVar7 = (Arena *)0x0;
    }
  }
  else {
    pEVar5->type = type;
    CVar1 = anon_unknown_26::cpp_type(type);
    if (CVar1 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2ab);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_69,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    pEVar5->is_repeated = false;
    pEVar5->field_0xa = pEVar5->field_0xa & 0xf;
LAB_002d80d6:
    pAVar7 = this->arena_;
  }
  if (pAVar3 == pAVar7) {
    (pEVar5->field_0).message_value = message;
  }
  else if (pAVar3 == (Arena *)0x0) {
    (pEVar5->field_0).message_value = message;
    ThreadSafeArena::AddCleanup
              ((ThreadSafeArena *)this->arena_,message,
               arena_delete_object<google::protobuf::MessageLite>);
  }
  else {
    iVar2 = (*message->_vptr_MessageLite[3])(message);
    pMVar6 = (MessageLite *)CONCAT44(extraout_var,iVar2);
    (pEVar5->field_0).message_value = pMVar6;
    (*pMVar6->_vptr_MessageLite[7])(pMVar6,message);
  }
LAB_002d81ef:
  pEVar5->field_0xa = pEVar5->field_0xa & 0xf0;
  return;
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  GOOGLE_DCHECK(message->GetOwningArena() == nullptr ||
         message->GetOwningArena() == arena_);
  Arena* message_arena = message->GetOwningArena();
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    if (message_arena == arena_) {
      extension->message_value = message;
    } else if (message_arena == nullptr) {
      extension->message_value = message;
      arena_->Own(message);  // not nullptr because not equal to message_arena
    } else {
      extension->message_value = message->New(arena_);
      extension->message_value->CheckTypeAndMergeFrom(*message);
    }
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->lazymessage_value->SetAllocatedMessage(message, arena_);
    } else {
      if (arena_ == nullptr) {
        delete extension->message_value;
      }
      if (message_arena == arena_) {
        extension->message_value = message;
      } else if (message_arena == nullptr) {
        extension->message_value = message;
        arena_->Own(message);  // not nullptr because not equal to message_arena
      } else {
        extension->message_value = message->New(arena_);
        extension->message_value->CheckTypeAndMergeFrom(*message);
      }
    }
  }
  extension->is_cleared = false;
}